

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  ostream *poVar2;
  _InputArray local_1e8;
  allocator<char> local_1c9;
  string local_1c8 [32];
  _InputArray local_1a8;
  allocator<char> local_189;
  string local_188 [32];
  Mat local_168;
  undefined1 local_108 [8];
  Mat rotated;
  int angle;
  Mat img;
  string local_30 [8];
  string imgPath;
  
  imgPath.field_2._12_4_ = 0;
  std::operator<<((ostream *)&std::cout,"Enter Image File Path : ");
  std::__cxx11::string::string(local_30);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
  cv::imread((string *)&angle,(int)local_30);
  bVar1 = cv::Mat::empty();
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"Enter Angle : ");
    std::istream::operator>>((istream *)&std::cin,(int *)(rotated.step.buf + 1));
    rotated.step.buf[1]._0_4_ = (int)rotated.step.buf[1] % 0x168;
    cv::Mat::Mat(&local_168,(Mat *)&angle);
    rotate((Mat *)local_108,&local_168,(int)rotated.step.buf[1]);
    cv::Mat::~Mat(&local_168);
    bVar1 = cv::Mat::empty();
    if ((bVar1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_188,"Original",&local_189);
      cv::_InputArray::_InputArray(&local_1a8,(Mat *)&angle);
      cv::imshow(local_188,&local_1a8);
      cv::_InputArray::~_InputArray(&local_1a8);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator(&local_189);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1c8,"Rotated",&local_1c9);
      cv::_InputArray::_InputArray(&local_1e8,(Mat *)local_108);
      cv::imshow(local_1c8,&local_1e8);
      cv::_InputArray::~_InputArray(&local_1e8);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      cv::waitKey(0);
      imgPath.field_2._12_4_ = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"ERROR Rotating Image.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      imgPath.field_2._12_4_ = 0xffffffff;
    }
    rotated.step.buf[1]._4_4_ = 1;
    cv::Mat::~Mat((Mat *)local_108);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"ERROR Loading Image File.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    imgPath.field_2._12_4_ = 0xffffffff;
    rotated.step.buf[1]._4_4_ = 1;
  }
  cv::Mat::~Mat((Mat *)&angle);
  std::__cxx11::string::~string(local_30);
  return imgPath.field_2._12_4_;
}

Assistant:

int main() {
    cout<<"Enter Image File Path : ";
    string imgPath;
    getline(cin,imgPath);
    Mat img = imread(imgPath,IMREAD_UNCHANGED);
    if(img.empty()){
        cout<<"ERROR Loading Image File."<<endl;
        return -1;
    }
    cout<<"Enter Angle : ";
    int angle;
    cin>>angle;
    angle = angle%360;
    Mat rotated = rotate(img,angle);
    if(rotated.empty()){
        cout<<"ERROR Rotating Image."<<endl;
        return -1;
    }
    imshow("Original", img);
    imshow("Rotated", rotated);
    waitKey(0);
    return 0;
}